

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O0

int __thiscall
curlpp::internal::CurlHandle::clone
          (CurlHandle *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  element_type *__p;
  CurlHandle *unaff_retaddr;
  CURL *cHandle;
  auto_ptr<curlpp::internal::CurlHandle> *newHandle;
  int iVar1;
  CurlHandle *pCVar2;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 isOkay;
  char *in_stack_ffffffffffffffd0;
  CurlHandle *handle;
  
  isOkay = (undefined1)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  pCVar2 = this;
  handle = this;
  curl_easy_duphandle(*(undefined8 *)(__fn + 8));
  iVar1 = (int)pCVar2;
  runtimeAssert(in_stack_ffffffffffffffd0,(bool)isOkay);
  __p = (element_type *)operator_new(0x150);
  CurlHandle(unaff_retaddr,handle);
  std::auto_ptr<curlpp::internal::CurlHandle>::auto_ptr
            ((auto_ptr<curlpp::internal::CurlHandle> *)this,__p);
  return iVar1;
}

Assistant:

std::auto_ptr<CurlHandle> 
CurlHandle::clone() const
{
	CURL * cHandle = curl_easy_duphandle(mCurl);
	runtimeAssert("Error when trying to curl_easy_duphandle() a handle", cHandle != NULL);
	auto_ptr<CurlHandle> newHandle(new CurlHandle(cHandle));

	return newHandle;
}